

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  ptls_raw_extension_t *ext;
  ptls_raw_extension_t *ppVar5;
  undefined8 uStack_38;
  
  if (properties != (ptls_handshake_properties_t *)0x0) {
    uStack_38 = 0;
    ppVar5 = properties->additional_extensions;
    if (ppVar5 != (ptls_raw_extension_t *)0x0) {
      for (; uVar1 = ppVar5->type, uVar1 != 0xffff; ppVar5 = ppVar5 + 1) {
        uStack_38 = CONCAT26(uVar1 << 8 | uVar1 >> 8,(undefined6)uStack_38);
        iVar3 = ptls_buffer__do_pushv(sendbuf,(void *)((long)&uStack_38 + 6),2);
        if (iVar3 != 0) {
          return iVar3;
        }
        iVar3 = ptls_buffer__do_pushv(sendbuf,"",2);
        if (iVar3 != 0) {
          return iVar3;
        }
        sVar2 = sendbuf->off;
        iVar3 = ptls_buffer__do_pushv(sendbuf,(ppVar5->data).base,(ppVar5->data).len);
        if (iVar3 != 0) {
          return iVar3;
        }
        lVar4 = sendbuf->off - sVar2;
        sendbuf->base[sVar2 - 2] = (uint8_t)((ulong)lVar4 >> 8);
        sendbuf->base[sVar2 - 1] = (uint8_t)lVar4;
      }
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}